

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O1

void ff4_cecil(dw_rom *rom)

{
  undefined8 uVar1;
  
  vpatch(rom,0x13b4,0x4f,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50,0,0x51,0,0x52,
         0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,
         0,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0xb8);
  vpatch(rom,0x14b4,0xf,0x48,0,0x49,0,0x4a,0,0x4b,0,0x4c,0,0x4d,0,0x4e,0,0x4f);
  vpatch(rom,0x14d4,0xf,0x48,0,0x49,0,0x4a,0,0x4b,0,0x4c,0,0x4d,0,0x4e,0,0x4f);
  vpatch(rom,0x14f4,0xf,0x98,0,0x99,3,0x9a,0,0x9b,3,0x9c,0,0x9d,3,0x9e,0,0x9f);
  vpatch(rom,0x1546,3,0x80,3,0x82);
  vpatch(rom,0x154e,1,0x80);
  vpatch(rom,0x15b4,0x43,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0x30,0,0x31,0,0x32,
         0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,
         0,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0xb0);
  vpatch(rom,0x16b4,0x4f,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0x40,0,0x41,0,0x42,
         0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,
         0,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0xa8);
  vpatch(rom,0x1a8c,2,3,0xf);
  uVar1 = 0xf0;
  vpatch(rom,0x12300,0x7f,5,8,0x10,0x16,0x12,0x58,0xb6,0x8f,7,0xf,0x1f,0x1f,0x1f,0x5f,0xff,0xfa,0xa0
         ,0x10,8,0x68,0x48,0x1a,0x6d,0xf1,0xe0,0xf0,0xf8,0xf8,0xf8,0xfa,0xff,0x5f,0x4f,0x3b,0x3c,
         0x1b,0xe,9,8,0xc,0x7c,0x3f,0x2f,0x1f,0xf,0xf,0xf,0xf,0xfe,0xd2,0x3e,0xbe,0xfc,0x90,0xe0,
         0x80,0x3e,0xfe,0xf2,0xf2,0xfc,0xf0,0xe0,0x80,5);
  vpatch(rom,0x12400,0x180,3,0xc,0x13,0x12,0x20,0x23,0x1f,0xf,3,0xf,0x1f,0x1f,0x3f,0x3c,0x1b,10,0xfc
         ,0x52,0x2c,0x48,0x90,0x28,0x94,0xa4,0xfc,0xfe,0xfc,0xf8,0xf0,0xf8,0x7c,0x7c,0xf,0x1f,0x3c,
         0x3d,0x1a,0xd,0x10,9,8,0x1f,0x27,0x27,0x1b,0xf,0x1f,0xf,0xe2,0x3c,0x6e,0xfe,0x5c,0xa8,0xc4,
         0xe4,0xfe,0xfc,0xf2,0xf2,0xfc,0xf8,0xfc,0xfc,3);
  vpatch(rom,0x12800,0x10,0x60,0x10,0x60,0x20,0xf0,0xf0,0xfc,0xfe,0xe0,0xf4,0xfc,0xf8,0xf0,0xd0,0x4c
         ,0x1e,uVar1);
  vpatch(rom,0x12820,0xf,0xff,0xff,0x2f,0,0x1f,0x1e,0xe,0,0x9e,0x9f,0x6f,0x4f,0x1f,0x1e,0);
  vpatch(rom,0x12980,0x7e,0x5a,0x81,0,0x66,0xa5,0x42,0xe7,0x7e,0x7e,0xff,0xff,0xff,0xff,0xff,0xbd,
         0x42,0x3c,0x7e,0xff,0xff,0xff,0xff,0xff,0xff,0x7e,0xff,0xff,0xff,0xff,0xff,0xff,0xff,0x8c,
         0x73,0x98,0xa6,0x65,0x1e,0x22,0x21,0xfc,0x7f,0xff,0xff,0x7f,0x1e,0x3e,0x3f,0xff,0x7e,0xe0,
         0xfe,0,0,0,0,0xff,0xff,0x1f,0xfe,0xff,0,0,0,0x5a);
  vpatch(rom,0x12a80,0xa0,0x24,0x42,0xbd,0xff,0xff,0xff,0xff,0xff,0x7e,0xff,0xff,0xf7,0xf7,0xca,0x8a
         ,0xc1,0xc5,0x32,0x25,9,0x32,0xfa,0xfa,0xfe,0xff,0xff,0xff,0xff,0xce,0xb6,0xa6,0x8e,0x9f,0xe
         ,9,0x1e,0x3e,0,0,1,0xf3,0xff,0xff,0x73,3,3,3,1,0x82,0x60,0x10,0x88,0x48,0x48,0x4e,0xe0,0xfe
         ,0xfe,0xfe,0xfe,0xfe,0xfe,0xfe,0xe0,0x24);
  vpatch(rom,0x12b27,1,7);
  vpatch(rom,0x12b2e,10,0,7,0xe3,0xd9,0x46,0xf1,0xe8,0x88,0x90,0x80);
  vpatch(rom,0x12b3f,1,0x80);
  vpatch(rom,0x12b50,0x10,4,2,0x9a,0x92,6,0x9b,0xfc,0xff,0xfc,0xfe,0xfe,0xfe,0xfe,0xff,0x97,0xf);
  vpatch(rom,0x12b67,1,0);
  vpatch(rom,0x12b6e,10,7,0,0xe3,0xd1,0x4c,0xe2,0xf2,0x10,0x20,0x3c);
  vpatch(rom,0x12b7f,0x81,0x3c,5,8,10,0x14,0x11,0x50,0xbb,0x8c,7,0xf,0xf,0x1f,0x1f,0x5f,0xff,0xff,
         0xa0,0x10,0x50,0x2c,0x8c,10,0xd0,0x3c,0xe0,0xf2,0xf7,0xfb,0xfb,0xfd,0xff,0xff,0xcb,0x78,
         0x3c,0x1a,0xe,9,8,0x1c,0xff,0x7f,0x2f,0x1f,0xf,0xf,0xf,0x1f,0xd2,0x1f,0x3f,0xd6,0xf0,0xa0,
         0xe0,0xf0,0xfe,0xf9,0xf9,0xf6,0xf0,0xe0,0xe0,0xf0);
  return;
}

Assistant:

static void ff4_cecil(dw_rom *rom)
{
    vpatch(rom, 0x013b4,   79,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0xb8,  0x00,  0xb9,  0x00,  0xba,  0x00,  0xbb,  0x00,  0xbc,  0x00,  0xbd,  0x00,  0xbe,  0x00,  0xbf);
    vpatch(rom, 0x014b4,   15,  0x48,  0x00,  0x49,  0x00,  0x4a,  0x00,  0x4b,  0x00,  0x4c,  0x00,  0x4d,  0x00,  0x4e,  0x00,  0x4f);
    vpatch(rom, 0x014d4,   15,  0x48,  0x00,  0x49,  0x00,  0x4a,  0x00,  0x4b,  0x00,  0x4c,  0x00,  0x4d,  0x00,  0x4e,  0x00,  0x4f);
    vpatch(rom, 0x014f4,   15,  0x98,  0x00,  0x99,  0x03,  0x9a,  0x00,  0x9b,  0x03,  0x9c,  0x00,  0x9d,  0x03,  0x9e,  0x00,  0x9f);
    vpatch(rom, 0x01546,    3,  0x80,  0x03,  0x82);
    vpatch(rom, 0x0154e,    1,  0x80);
    vpatch(rom, 0x015b4,   67,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0xb0,  0x03,  0xb1);
    vpatch(rom, 0x016b4,   79,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0xa8,  0x03,  0xa9,  0x00,  0xaa,  0x03,  0xab,  0x03,  0xac,  0x03,  0xad,  0x00,  0xae,  0x03,  0xaf);
    vpatch(rom, 0x01a8c,    2,  0x03,  0x0f);
    vpatch(rom, 0x12300,  127,  0x05,  0x08,  0x10,  0x16,  0x12,  0x58,  0xb6,  0x8f,  0x07,  0x0f,  0x1f,  0x1f,  0x1f,  0x5f,  0xff,  0xfa,  0xa0,  0x10,  0x08,  0x68,  0x48,  0x1a,  0x6d,  0xf1,  0xe0,  0xf0,  0xf8,  0xf8,  0xf8,  0xfa,  0xff,  0x5f,  0x4f,  0x3b,  0x3c,  0x1b,  0x0e,  0x09,  0x08,  0x0c,  0x7c,  0x3f,  0x2f,  0x1f,  0x0f,  0x0f,  0x0f,  0x0f,  0xfe,  0xd2,  0x3e,  0xbe,  0xfc,  0x90,  0xe0,  0x80,  0x3e,  0xfe,  0xf2,  0xf2,  0xfc,  0xf0,  0xe0,  0x80,  0x05,  0x08,  0x10,  0x16,  0x12,  0x58,  0xb6,  0x8f,  0x07,  0x0f,  0x1f,  0x1f,  0x1f,  0x5f,  0xff,  0xfa,  0xa0,  0x10,  0x08,  0x68,  0x48,  0x1a,  0x6d,  0xf1,  0xe0,  0xf0,  0xf8,  0xf8,  0xf8,  0xfa,  0xff,  0x5f,  0x7f,  0x4b,  0x7c,  0x7d,  0x3f,  0x09,  0x07,  0x01,  0x7c,  0x7f,  0x4f,  0x4f,  0x3f,  0x0f,  0x07,  0x01,  0xf2,  0xdc,  0x3c,  0xd8,  0x70,  0x90,  0x10,  0x30,  0x3e,  0xfc,  0xf4,  0xf8,  0xf0,  0xf0,  0xf0);
    vpatch(rom, 0x12400,  384,  0x03,  0x0c,  0x13,  0x12,  0x20,  0x23,  0x1f,  0x0f,  0x03,  0x0f,  0x1f,  0x1f,  0x3f,  0x3c,  0x1b,  0x0a,  0xfc,  0x52,  0x2c,  0x48,  0x90,  0x28,  0x94,  0xa4,  0xfc,  0xfe,  0xfc,  0xf8,  0xf0,  0xf8,  0x7c,  0x7c,  0x0f,  0x1f,  0x3c,  0x3d,  0x1a,  0x0d,  0x10,  0x09,  0x08,  0x1f,  0x27,  0x27,  0x1b,  0x0f,  0x1f,  0x0f,  0xe2,  0x3c,  0x6e,  0xfe,  0x5c,  0xa8,  0xc4,  0xe4,  0xfe,  0xfc,  0xf2,  0xf2,  0xfc,  0xf8,  0xfc,  0xfc,  0x03,  0x0c,  0x13,  0x12,  0x20,  0x23,  0x1f,  0x0f,  0x03,  0x0f,  0x1f,  0x1f,  0x3f,  0x3c,  0x1b,  0x0a,  0xfc,  0x52,  0x2c,  0x48,  0x90,  0x28,  0x94,  0xa4,  0xfc,  0xfe,  0xfc,  0xf8,  0xf0,  0xf8,  0x7c,  0x7c,  0x0f,  0x07,  0x04,  0x05,  0x02,  0x01,  0x01,  0x02,  0x08,  0x07,  0x07,  0x07,  0x03,  0x01,  0x01,  0x03,  0xc4,  0x38,  0x64,  0xf4,  0xf8,  0xe0,  0x10,  0x10,  0xfc,  0xf8,  0xfc,  0x9c,  0x98,  0xe0,  0xf0,  0xf0,  0x3f,  0x4a,  0x34,  0x12,  0x09,  0x14,  0x29,  0x25,  0x3f,  0x7f,  0x3f,  0x1f,  0x0f,  0x1f,  0x3e,  0x3e,  0xc0,  0x30,  0xc8,  0x48,  0x04,  0xc4,  0xf8,  0xf0,  0xc0,  0xf0,  0xf8,  0xf8,  0xfc,  0x3c,  0xd8,  0x50,  0x23,  0x1c,  0x26,  0x2f,  0x1f,  0x07,  0x08,  0x08,  0x3f,  0x1f,  0x3f,  0x39,  0x19,  0x07,  0x0f,  0x0f,  0xf0,  0xe0,  0x20,  0xa0,  0x40,  0x80,  0x80,  0x40,  0x10,  0xe0,  0xe0,  0xe0,  0xc0,  0x80,  0x80,  0xc0,  0x3f,  0x4a,  0x34,  0x12,  0x09,  0x14,  0x29,  0x25,  0x3f,  0x7f,  0x3f,  0x1f,  0x0f,  0x1f,  0x3e,  0x3e,  0xc0,  0x30,  0xc8,  0x48,  0x04,  0xc4,  0xf8,  0xf0,  0xc0,  0xf0,  0xf8,  0xf8,  0xfc,  0x3c,  0xd8,  0x50,  0x47,  0x3c,  0x76,  0x7f,  0x3a,  0x15,  0x23,  0x27,  0x7f,  0x3f,  0x4f,  0x4f,  0x3f,  0x1f,  0x3f,  0x3f,  0xf0,  0xf8,  0x3c,  0xbc,  0x58,  0xb0,  0x08,  0x90,  0x10,  0xf8,  0xe4,  0xe4,  0xd8,  0xf0,  0xf8,  0xf0,  0x05,  0x08,  0x0a,  0x14,  0x11,  0x50,  0xbb,  0x8c,  0x07,  0x0f,  0x0f,  0x1f,  0x1f,  0x5f,  0xff,  0xff,  0xa0,  0x10,  0x50,  0x28,  0x88,  0x0a,  0xdd,  0x31,  0xe0,  0xf0,  0xf0,  0xf8,  0xf8,  0xfa,  0xff,  0xff,  0xcb,  0x78,  0x3c,  0x1a,  0x0e,  0x09,  0x08,  0x1c,  0xff,  0x7f,  0x2f,  0x1f,  0x0f,  0x0f,  0x0f,  0x1f,  0xd2,  0x1f,  0x3f,  0xd6,  0xf0,  0xa0,  0xe0,  0xf0,  0xfe,  0xf9,  0xf9,  0xf6,  0xf0,  0xe0,  0xe0,  0xf0,  0x05,  0x08,  0x0a,  0x14,  0x11,  0x50,  0xbb,  0x8c,  0x07,  0x0f,  0x0f,  0x1f,  0x1f,  0x5f,  0xff,  0xff,  0xa0,  0x10,  0x50,  0x28,  0x88,  0x0a,  0xdd,  0x31,  0xe0,  0xf0,  0xf0,  0xf8,  0xf8,  0xfa,  0xff,  0xff,  0x4b,  0xf8,  0xfc,  0x6b,  0x0f,  0x05,  0x07,  0x0f,  0x7f,  0x9f,  0x9f,  0x6f,  0x0f,  0x07,  0x07,  0x0f,  0xd3,  0x1e,  0x3c,  0x58,  0x70,  0x90,  0x10,  0x38,  0xff,  0xfe,  0xf4,  0xf8,  0xf0,  0xf0,  0xf0,  0xf8);
    vpatch(rom, 0x12800,   16,  0x60,  0x10,  0x60,  0x20,  0xf0,  0xf0,  0xfc,  0xfe,  0xe0,  0xf4,  0xfc,  0xf8,  0xf0,  0xd0,  0x4c,  0x1e);
    vpatch(rom, 0x12820,   15,  0xff,  0xff,  0x2f,  0x00,  0x1f,  0x1e,  0x0e,  0x00,  0x9e,  0x9f,  0x6f,  0x4f,  0x1f,  0x1e,  0x00);
    vpatch(rom, 0x12980,  126,  0x5a,  0x81,  0x00,  0x66,  0xa5,  0x42,  0xe7,  0x7e,  0x7e,  0xff,  0xff,  0xff,  0xff,  0xff,  0xbd,  0x42,  0x3c,  0x7e,  0xff,  0xff,  0xff,  0xff,  0xff,  0xff,  0x7e,  0xff,  0xff,  0xff,  0xff,  0xff,  0xff,  0xff,  0x8c,  0x73,  0x98,  0xa6,  0x65,  0x1e,  0x22,  0x21,  0xfc,  0x7f,  0xff,  0xff,  0x7f,  0x1e,  0x3e,  0x3f,  0xff,  0x7e,  0xe0,  0xfe,  0x00,  0x00,  0x00,  0x00,  0xff,  0xff,  0x1f,  0xfe,  0xff,  0x00,  0x00,  0x00,  0x5a,  0x81,  0x00,  0x66,  0xa5,  0x42,  0xe7,  0x7e,  0x7e,  0xff,  0xff,  0xff,  0xff,  0xff,  0xbd,  0x42,  0x3c,  0x7e,  0xff,  0xff,  0xff,  0xff,  0xff,  0xff,  0x7e,  0xff,  0xff,  0xff,  0xff,  0xff,  0xff,  0xff,  0x8c,  0x73,  0x98,  0xa6,  0xe9,  0x56,  0x8a,  0x91,  0xfc,  0x7f,  0xff,  0xff,  0xff,  0x7e,  0xfe,  0xff,  0xff,  0x7e,  0xe0,  0xfe,  0x00,  0x00,  0x00,  0x00,  0xff,  0xff,  0x1f,  0xfe,  0xfe,  0xff);
    vpatch(rom, 0x12a80,  160,  0x24,  0x42,  0xbd,  0xff,  0xff,  0xff,  0xff,  0xff,  0x7e,  0xff,  0xff,  0xf7,  0xf7,  0xca,  0x8a,  0xc1,  0xc5,  0x32,  0x25,  0x09,  0x32,  0xfa,  0xfa,  0xfe,  0xff,  0xff,  0xff,  0xff,  0xce,  0xb6,  0xa6,  0x8e,  0x9f,  0x0e,  0x09,  0x1e,  0x3e,  0x00,  0x00,  0x01,  0xf3,  0xff,  0xff,  0x73,  0x03,  0x03,  0x03,  0x01,  0x82,  0x60,  0x10,  0x88,  0x48,  0x48,  0x4e,  0xe0,  0xfe,  0xfe,  0xfe,  0xfe,  0xfe,  0xfe,  0xfe,  0xe0,  0x24,  0x42,  0xbd,  0xff,  0xff,  0xff,  0xff,  0xff,  0x7e,  0xff,  0xff,  0xf7,  0xf7,  0xca,  0x8a,  0xc1,  0xc5,  0x32,  0x25,  0x09,  0x32,  0xfa,  0xfa,  0xfe,  0xff,  0xff,  0xff,  0xff,  0xce,  0xb6,  0xa6,  0x8e,  0x9f,  0x0e,  0x09,  0x1e,  0x3e,  0x00,  0x01,  0x00,  0xf3,  0xff,  0xff,  0x73,  0x03,  0x03,  0x01,  0x00,  0x82,  0x70,  0x08,  0xc4,  0x24,  0x2e,  0xde,  0x1e,  0xfe,  0xfe,  0xfe,  0xfe,  0xfe,  0xfe,  0xc0,  0x1e,  0x34,  0x59,  0xe7,  0xdf,  0xff,  0xff,  0xff,  0xff,  0x3e,  0x7f,  0xff,  0xff,  0xfd,  0xf5,  0xe5,  0xf1,  0x04,  0x02,  0x9a,  0x92,  0x06,  0x9b,  0xfc,  0xff,  0xfc,  0xfe,  0xfe,  0xfe,  0xfe,  0xff,  0x97,  0x0f);
    vpatch(rom, 0x12b27,    1,  0x07);
    vpatch(rom, 0x12b2e,   10,  0x00,  0x07,  0xe3,  0xd9,  0x46,  0xf1,  0xe8,  0x88,  0x90,  0x80);
    vpatch(rom, 0x12b3f,    1,  0x80);
    vpatch(rom, 0x12b50,   16,  0x04,  0x02,  0x9a,  0x92,  0x06,  0x9b,  0xfc,  0xff,  0xfc,  0xfe,  0xfe,  0xfe,  0xfe,  0xff,  0x97,  0x0f);
    vpatch(rom, 0x12b67,    1,  0x00);
    vpatch(rom, 0x12b6e,   10,  0x07,  0x00,  0xe3,  0xd1,  0x4c,  0xe2,  0xf2,  0x10,  0x20,  0x3c);
    vpatch(rom, 0x12b7f,  129,  0x3c,  0x05,  0x08,  0x0a,  0x14,  0x11,  0x50,  0xbb,  0x8c,  0x07,  0x0f,  0x0f,  0x1f,  0x1f,  0x5f,  0xff,  0xff,  0xa0,  0x10,  0x50,  0x2c,  0x8c,  0x0a,  0xd0,  0x3c,  0xe0,  0xf2,  0xf7,  0xfb,  0xfb,  0xfd,  0xff,  0xff,  0xcb,  0x78,  0x3c,  0x1a,  0x0e,  0x09,  0x08,  0x1c,  0xff,  0x7f,  0x2f,  0x1f,  0x0f,  0x0f,  0x0f,  0x1f,  0xd2,  0x1f,  0x3f,  0xd6,  0xf0,  0xa0,  0xe0,  0xf0,  0xfe,  0xf9,  0xf9,  0xf6,  0xf0,  0xe0,  0xe0,  0xf0,  0x05,  0x08,  0x0a,  0x14,  0x11,  0x50,  0xbb,  0x8c,  0x07,  0x0f,  0x0f,  0x1f,  0x1f,  0x5f,  0xff,  0xff,  0xa0,  0x10,  0x50,  0x2c,  0x8c,  0x0a,  0xd0,  0x3c,  0xe0,  0xf2,  0xf7,  0xfb,  0xfb,  0xfd,  0xff,  0xff,  0x4b,  0xf8,  0xfc,  0x6b,  0x0f,  0x05,  0x07,  0x0f,  0x7f,  0x9f,  0x9f,  0x6f,  0x0f,  0x07,  0x07,  0x0f,  0xd2,  0x1e,  0x3c,  0x58,  0x70,  0x90,  0x10,  0x38,  0xfe,  0xfe,  0xf4,  0xf8,  0xf0,  0xf0,  0xf0,  0xf8);
}